

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O0

int If_CutDelaySop(If_Man_t *p,If_Cut_t *pCut)

{
  float fVar1;
  double dVar2;
  double dVar3;
  Vec_Wec_t *p_00;
  char cVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  If_Obj_t *pObj;
  If_Cut_t *pIVar9;
  Vec_Int_t *p_01;
  bool bVar10;
  int local_48;
  int DelayMax;
  int Delay;
  int nLitMax;
  int i;
  If_Obj_t *pLeaf;
  Vec_Int_t *vCover;
  char *pPerm;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  pcVar8 = If_CutPerm(pCut);
  *(uint *)&pCut->field_0x1c = *(uint *)&pCut->field_0x1c & 0xffffdfff | 0x2000;
  if (*(uint *)&pCut->field_0x1c >> 0x18 == 0) {
    p_local._4_4_ = 0;
  }
  else if (*(uint *)&pCut->field_0x1c >> 0x18 == 1) {
    pObj = If_CutLeaf(p,pCut,0);
    pIVar9 = If_ObjCutBest(pObj);
    p_local._4_4_ = (int)pIVar9->Delay;
  }
  else {
    p_00 = p->vTtIsops[*(uint *)&pCut->field_0x1c >> 0x18];
    iVar5 = If_CutTruthLit(pCut);
    iVar5 = Abc_Lit2Var(iVar5);
    p_01 = Vec_WecEntry(p_00,iVar5);
    iVar5 = Vec_IntSize(p_01);
    if (iVar5 == 0) {
      p_local._4_4_ = -1;
    }
    else {
      iVar5 = Vec_IntSize(p_01);
      if (p->pPars->nGateSize < iVar5) {
        p_local._4_4_ = -1;
      }
      else {
        iVar5 = If_CutLeaveNum(pCut);
        if ((iVar5 < 0) || (iVar5 = If_CutLeaveNum(pCut), 0x10 < iVar5)) {
          __assert_fail("If_CutLeaveNum(pCut) >= 0 && If_CutLeaveNum(pCut) <= 16",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                        ,0x56,"int If_CutDelaySop(If_Man_t *, If_Cut_t *)");
        }
        iVar5 = If_CutLeaveNum(pCut);
        iVar5 = If_CutMaxCubeSize(p_01,iVar5);
        iVar6 = Vec_IntSize(p_01);
        if (iVar6 < 2) {
          uVar7 = Vec_IntSize(p_01);
          *(uint *)&pCut->field_0x1c = *(uint *)&pCut->field_0x1c & 0xfffff000 | uVar7 & 0xfff;
          iVar5 = If_CutLeaveNum(pCut);
          dVar2 = If_CutDelaySop::GateDelays[iVar5];
          local_48 = 0;
          Delay = 0;
          while( true ) {
            bVar10 = false;
            if (Delay < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
              _nLitMax = If_ManObj(p,(int)(&pCut[1].Area)[Delay]);
              bVar10 = _nLitMax != (If_Obj_t *)0x0;
            }
            if (!bVar10) break;
            pIVar9 = If_ObjCutBest(_nLitMax);
            fVar1 = pIVar9->Delay;
            cVar4 = (char)(int)(dVar2 + 0.5);
            pcVar8[Delay] = cVar4;
            local_48 = Abc_MaxInt(local_48,(int)(fVar1 + (float)(int)cVar4));
            Delay = Delay + 1;
          }
        }
        else {
          iVar6 = Vec_IntSize(p_01);
          *(uint *)&pCut->field_0x1c = *(uint *)&pCut->field_0x1c & 0xfffff000 | iVar6 + 1U & 0xfff;
          iVar6 = If_CutLeaveNum(pCut);
          dVar2 = If_CutDelaySop::GateDelays[iVar6];
          dVar3 = If_CutDelaySop::GateDelays[iVar5];
          local_48 = 0;
          Delay = 0;
          while( true ) {
            bVar10 = false;
            if (Delay < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
              _nLitMax = If_ManObj(p,(int)(&pCut[1].Area)[Delay]);
              bVar10 = _nLitMax != (If_Obj_t *)0x0;
            }
            if (!bVar10) break;
            pIVar9 = If_ObjCutBest(_nLitMax);
            fVar1 = pIVar9->Delay;
            cVar4 = (char)(int)(dVar2 + dVar3 + 0.5);
            pcVar8[Delay] = cVar4;
            local_48 = Abc_MaxInt(local_48,(int)(fVar1 + (float)(int)cVar4));
            Delay = Delay + 1;
          }
        }
        p_local._4_4_ = local_48;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int If_CutDelaySop( If_Man_t * p, If_Cut_t * pCut )
{
    char * pPerm = If_CutPerm( pCut );
    // delay is calculated using 1+log2(NumFanins)
    static double GateDelays[20] = { 1.00, 1.00, 2.00, 2.58, 3.00, 3.32, 3.58, 3.81, 4.00, 4.17, 4.32, 4.46, 4.58, 4.70, 4.81, 4.91, 5.00, 5.09, 5.17, 5.25 };
    Vec_Int_t * vCover;
    If_Obj_t * pLeaf;
    int i, nLitMax, Delay, DelayMax;
    // mark cut as a user cut
    pCut->fUser = 1;
    if ( pCut->nLeaves == 0 )
        return 0;
    if ( pCut->nLeaves == 1 )
        return (int)If_ObjCutBest(If_CutLeaf(p, pCut, 0))->Delay;
    vCover = Vec_WecEntry( p->vTtIsops[pCut->nLeaves], Abc_Lit2Var(If_CutTruthLit(pCut)) );
    if ( Vec_IntSize(vCover) == 0 )
        return -1;
    // mark the output as complemented
//    vAnds = If_CutDelaySopAnds( p, pCut, vCover, RetValue ^ pCut->fCompl );
    if ( Vec_IntSize(vCover) > p->pPars->nGateSize )
        return -1;
    // set the area cost
    assert( If_CutLeaveNum(pCut) >= 0 && If_CutLeaveNum(pCut) <= 16 );
    // compute the gate delay
    nLitMax = If_CutMaxCubeSize( vCover, If_CutLeaveNum(pCut) );
    if ( Vec_IntSize(vCover) < 2 )
    {
        pCut->Cost = Vec_IntSize(vCover);
        Delay = (int)(GateDelays[If_CutLeaveNum(pCut)] + 0.5);
        DelayMax = 0;
        If_CutForEachLeaf( p, pCut, pLeaf, i )
            DelayMax = Abc_MaxInt( DelayMax, If_ObjCutBest(pLeaf)->Delay + (pPerm[i] = (char)Delay) );
    }
    else
    {
        pCut->Cost = Vec_IntSize(vCover) + 1;
        Delay = (int)(GateDelays[If_CutLeaveNum(pCut)] + GateDelays[nLitMax] + 0.5);
        DelayMax = 0;
        If_CutForEachLeaf( p, pCut, pLeaf, i )
            DelayMax = Abc_MaxInt( DelayMax, If_ObjCutBest(pLeaf)->Delay + (pPerm[i] = (char)Delay) );
    }
    return DelayMax;
}